

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O1

BOOL __thiscall
LASinterval::merge_cells(LASinterval *this,U32 num_indices,I32 *indices,I32 new_index)

{
  BOOL BVar1;
  __node_base_ptr p_Var2;
  ulong uVar3;
  _Node_iterator_base<std::pair<const_int,_LASintervalStartCell_*>,_false> __it;
  
  if (num_indices == 1) {
    __it._M_cur = (__node_type *)0x0;
    p_Var2 = std::
             _Hashtable<int,_std::pair<const_int,_LASintervalStartCell_*>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       ((_Hashtable<int,_std::pair<const_int,_LASintervalStartCell_*>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)this->cells,
                        (ulong)(long)*indices %
                        ((_Hashtable<int,_std::pair<const_int,_LASintervalStartCell_*>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)this->cells)->_M_bucket_count,indices,(long)*indices);
    if (p_Var2 != (__node_base_ptr)0x0) {
      __it._M_cur = (__node_type *)p_Var2->_M_nxt;
    }
    if (__it._M_cur == (__node_type *)0x0) {
      return false;
    }
    std::
    _Hashtable<int,std::pair<int_const,LASintervalStartCell*>,std::allocator<std::pair<int_const,LASintervalStartCell*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<int_const,LASintervalStartCell*>>
              ((_Hashtable<int,std::pair<int_const,LASintervalStartCell*>,std::allocator<std::pair<int_const,LASintervalStartCell*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this->cells);
    std::
    _Hashtable<int,_std::pair<const_int,_LASintervalStartCell_*>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<int,_std::pair<const_int,_LASintervalStartCell_*>,_std::allocator<std::pair<const_int,_LASintervalStartCell_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this->cells,(const_iterator)__it._M_cur);
  }
  else {
    if ((_Rb_tree<LASintervalStartCell_*,_LASintervalStartCell_*,_std::_Identity<LASintervalStartCell_*>,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
         *)this->cells_to_merge !=
        (_Rb_tree<LASintervalStartCell_*,_LASintervalStartCell_*,_std::_Identity<LASintervalStartCell_*>,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
         *)0x0) {
      std::
      _Rb_tree<LASintervalStartCell_*,_LASintervalStartCell_*,_std::_Identity<LASintervalStartCell_*>,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
      ::clear((_Rb_tree<LASintervalStartCell_*,_LASintervalStartCell_*,_std::_Identity<LASintervalStartCell_*>,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
               *)this->cells_to_merge);
    }
    if (num_indices != 0) {
      uVar3 = 0;
      do {
        add_cell_to_merge_cell_set(this,indices[uVar3],true);
        uVar3 = uVar3 + 1;
      } while (num_indices != uVar3);
    }
    BVar1 = merge(this,true);
    if (!BVar1) {
      return false;
    }
    std::
    _Hashtable<int,std::pair<int_const,LASintervalStartCell*>,std::allocator<std::pair<int_const,LASintervalStartCell*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<int_const,LASintervalStartCell*>>
              ((_Hashtable<int,std::pair<int_const,LASintervalStartCell*>,std::allocator<std::pair<int_const,LASintervalStartCell*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this->cells);
    this->merged_cells = (LASintervalStartCell *)0x0;
  }
  return true;
}

Assistant:

BOOL LASinterval::merge_cells(const U32 num_indices, const I32* indices, const I32 new_index)
{
  U32 i;
  if (num_indices == 1)
  {
    my_cell_hash::iterator hash_element = ((my_cell_hash*)cells)->find(indices[0]);
    if (hash_element == ((my_cell_hash*)cells)->end())
    {
      return FALSE;
    }
    ((my_cell_hash*)cells)->insert(my_cell_hash::value_type(new_index, (*hash_element).second));
    ((my_cell_hash*)cells)->erase(hash_element);
  }
  else
  {
    if (cells_to_merge) ((my_cell_set*)cells_to_merge)->clear();
    for (i = 0; i < num_indices; i++)
    {
      add_cell_to_merge_cell_set(indices[i], TRUE);
    }
    if (!merge(TRUE)) return FALSE;
    ((my_cell_hash*)cells)->insert(my_cell_hash::value_type(new_index, merged_cells));
    merged_cells = 0;
  }
  return TRUE;
}